

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::get_component<signed_char>(Omega_h *this,Read<signed_char> *a,Int ncomps,Int comp)

{
  Alloc *pAVar1;
  int iVar2;
  void *extraout_RDX;
  LO n;
  Read<signed_char> RVar3;
  Write<signed_char> b;
  type f;
  allocator local_71;
  Write<signed_char> local_70;
  type local_60;
  Write<signed_char> local_38;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar2 = (int)pAVar1->size;
  }
  else {
    iVar2 = (int)((ulong)pAVar1 >> 3);
  }
  iVar2 = divide_no_remainder<int>(iVar2,ncomps);
  std::__cxx11::string::string((string *)&local_60,"",&local_71);
  Write<signed_char>::Write(&local_70,iVar2,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  Write<signed_char>::Write(&local_60.b,&local_70);
  Write<signed_char>::Write(&local_60.a.write_,&a->write_);
  if (((ulong)local_70.shared_alloc_.alloc & 1) == 0) {
    n = (LO)(local_70.shared_alloc_.alloc)->size;
  }
  else {
    n = (LO)((ulong)local_70.shared_alloc_.alloc >> 3);
  }
  local_60.ncomps = ncomps;
  local_60.comp = comp;
  parallel_for<Omega_h::get_component<signed_char>(Omega_h::Read<signed_char>,int,int)::_lambda(int)_1_>
            (n,&local_60,"get_component");
  Write<signed_char>::Write(&local_38,&local_70);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_38);
  Write<signed_char>::~Write(&local_38);
  get_component<signed_char>(Omega_h::Read<signed_char>,int,int)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_60);
  Write<signed_char>::~Write(&local_70);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> get_component(Read<T> a, Int ncomps, Int comp) {
  Write<T> b(divide_no_remainder(a.size(), ncomps));
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = a[i * ncomps + comp]; };
  parallel_for(b.size(), f, "get_component");
  return b;
}